

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O0

int __thiscall spatial_region::init(spatial_region *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  pwpo *ppVar2;
  particle **pppVar3;
  void *pvVar4;
  _Requires<_Callable<void_(&)(particle_&,_vector3d_&,_vector3d_&,_double)>,_function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>_&>
  pfVar5;
  function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *pfVar6;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double unaff_retaddr;
  field3d<cellj> *in_stack_00000008;
  field3d<cellb> *in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  pwpo *b;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  field3d<celle> *in_stack_ffffffffffffff88;
  ndfx_solver *in_stack_ffffffffffffff90;
  undefined4 in_stack_fffffffffffffff0;
  spatial_region *dx;
  
  iVar1 = (int)ctx;
  this->sr_id = iVar1;
  this->dx = in_XMM0_Qa;
  this->dy = in_XMM1_Qa;
  this->dz = in_XMM2_Qa;
  this->dt = in_XMM3_Qa;
  this->e_s = in_XMM4_Qa;
  this->xnpic = in_EDX;
  this->ynpic = in_ECX;
  this->znpic = in_R8D;
  this->n_ion_populations = in_R9D;
  this->icmr = (double *)in_stack_00000008;
  dx = this;
  std::__cxx11::string::operator=((string *)&this->data_folder,(string *)in_stack_00000010);
  ppVar2 = (pwpo *)operator_new(0x10);
  ppVar2->previous = (pwpo *)0x0;
  pppVar3 = (particle **)malloc((long)this->page_size);
  ppVar2->head = pppVar3;
  this->npwpo = this->npwpo + 1;
  this->p_lapwpo = ppVar2;
  if (in_stack_00000018 == 0) {
    pvVar4 = operator_new(0x50);
    fdtd_solver::fdtd_solver
              ((fdtd_solver *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (field3d<cellb> *)CONCAT44(in_stack_00000018,in_stack_ffffffffffffff80),
               (field3d<cellj> *)this,in_stack_ffffffffffffff70,(double)pvVar4,
               (double)in_stack_ffffffffffffff60,
               (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,std::default_delete<maxwell_solver>>::
    unique_ptr<std::default_delete<maxwell_solver>,void>
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (pointer)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::operator=
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::~unique_ptr
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60);
  }
  else if (in_stack_00000018 == 1) {
    pvVar4 = operator_new(0x70);
    ndfx_solver::ndfx_solver
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (field3d<cellb> *)CONCAT44(in_stack_00000018,in_stack_ffffffffffffff80),
               (field3d<cellj> *)this,(double)pvVar4,in_stack_ffffffffffffff68,
               (double)in_stack_ffffffffffffff60,
               (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,std::default_delete<maxwell_solver>>::
    unique_ptr<std::default_delete<maxwell_solver>,void>
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (pointer)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::operator=
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::~unique_ptr
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60);
  }
  else if (in_stack_00000018 == 2) {
    in_stack_ffffffffffffff60 =
         (function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)operator_new(0x80);
    five_point_solver::five_point_solver
              ((five_point_solver *)CONCAT44(in_stack_00000024,in_stack_00000020),
               (field3d<celle> *)CONCAT44(in_stack_0000001c,2),in_stack_00000010,in_stack_00000008,
               unaff_retaddr,(double)dx,(double)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_XMM0_Qa
              );
    std::unique_ptr<maxwell_solver,std::default_delete<maxwell_solver>>::
    unique_ptr<std::default_delete<maxwell_solver>,void>
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (pointer)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::operator=
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::~unique_ptr
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60);
  }
  else {
    std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::operator=
              ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
               in_stack_ffffffffffffff60,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  if (in_stack_00000020 == 0) {
    pfVar5 = std::function<void(particle&,vector3d&,vector3d&,double&)>::operator=
                       ((function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)
                        CONCAT44(in_stack_00000018,in_stack_ffffffffffffff80),
                        (_func_void_particle_ptr_vector3d_ptr_vector3d_ptr_double *)this);
    iVar1 = (int)pfVar5;
  }
  else if (in_stack_00000020 == 1) {
    pfVar5 = std::function<void(particle&,vector3d&,vector3d&,double&)>::operator=
                       ((function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)
                        CONCAT44(in_stack_00000018,in_stack_ffffffffffffff80),
                        (_func_void_particle_ptr_vector3d_ptr_vector3d_ptr_double *)this);
    iVar1 = (int)pfVar5;
  }
  else {
    pfVar6 = std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::operator=
                       (in_stack_ffffffffffffff60,
                        (nullptr_t)CONCAT44(in_stack_00000020,in_stack_ffffffffffffff58));
    iVar1 = (int)pfVar6;
  }
  return iVar1;
}

Assistant:

void spatial_region::init(int sr_id0, double dx0, double dy0, double dz0, double dt0, double e_s0, int xnpic0,
        int ynpic0, int znpic0, int n_ion_populations0, double* icmr0, std::string df,
        maxwell_solver_enum solver0, pusher_enum pusher)
{
    sr_id = sr_id0;
    dx = dx0;
    dy = dy0;
    dz = dz0;
    dt = dt0;
    e_s = e_s0;
    xnpic = xnpic0;
    ynpic = ynpic0;
    znpic = znpic0;
    n_ion_populations = n_ion_populations0;
    icmr = icmr0;
    data_folder = df;

    // we should always have at least one page for free particles (to avoid performance issues)
    pwpo* b = new pwpo;
    b->previous = 0;
    b->head = (particle**) malloc(page_size);
    npwpo++;
    p_lapwpo = b;

    switch (solver0) {
    case maxwell_solver_enum::NDFX:
        solver = unique_ptr<maxwell_solver>(new ndfx_solver(ce, cb, cj, dt, dx, dy, dz));
        break;
    case maxwell_solver_enum::FDTD:
        solver = unique_ptr<maxwell_solver>(new fdtd_solver(ce, cb, cj, dt, dx, dy, dz));
        break;
    case maxwell_solver_enum::FIVE_POINT:
        solver = unique_ptr<maxwell_solver>(new five_point_solver(ce, cb, cj, dt, dx, dy, dz));
        break;
    default:
        solver = nullptr;
    }

    switch (pusher) {
    case pusher_enum::BORIS:
        advance_momentum = push_boris;
        break;
    case pusher_enum::VAY:
        advance_momentum = push_vay;
        break;
    default:
        advance_momentum = nullptr;
    }
}